

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::transform
          (Impl *this,Atom_t head,weight_t bound,WeightLitSpan *wlits,Strategy s)

{
  uint uVar1;
  pointer pWVar2;
  pointer plVar3;
  bool bVar4;
  uint32 uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  LitSpan local_48;
  
  this->bound_ = bound;
  bk_lib::pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>::
  assign<Potassco::WeightLit_t_const*>
            ((pod_vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>> *)&this->agg_,
             wlits->first,wlits->first + wlits->size);
  pWVar2 = (this->agg_).ebo_.buf;
  bVar4 = isSorted<Potassco::WeightLit_t*,Clasp::Asp::RuleTransform::Impl::CmpW>
                    (pWVar2,pWVar2 + (this->agg_).ebo_.size);
  if (!bVar4) {
    pWVar2 = (this->agg_).ebo_.buf;
    std::
    __stable_sort<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::Asp::RuleTransform::Impl::CmpW>>
              (pWVar2,pWVar2 + (this->agg_).ebo_.size);
  }
  local_48.first = (int *)0x0;
  bk_lib::pod_vector<long,_std::allocator<long>_>::resize
            (&this->sumR_,(this->agg_).ebo_.size,(long *)&local_48);
  uVar1 = (this->agg_).ebo_.size;
  pWVar2 = (this->agg_).ebo_.buf;
  plVar3 = (this->sumR_).ebo_.buf;
  lVar6 = 0;
  uVar7 = (ulong)uVar1;
  do {
    bVar4 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar4) {
      iVar8 = this->bound_;
      uVar5 = 0;
      if (iVar8 <= lVar6) {
        if (iVar8 < 1) {
          local_48.first = (pointer)0x0;
          local_48.size = 0;
        }
        else {
          if ((long)iVar8 <= lVar6 - pWVar2[uVar1 - 1].weight) {
            if ((s != strategy_no_aux) && ((s != strategy_default || (5 < lVar6)))) {
              uVar5 = transformSplit(this,head);
              return uVar5;
            }
            uVar5 = transformSelect(this,head);
            return uVar5;
          }
          (this->lits_).ebo_.size = 0;
          for (lVar6 = 0; (ulong)uVar1 << 3 != lVar6; lVar6 = lVar6 + 8) {
            local_48.first =
                 (int *)CONCAT44(local_48.first._4_4_,*(undefined4 *)((long)&pWVar2->lit + lVar6));
            bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_48);
          }
          local_48.size = (size_t)(this->lits_).ebo_.size;
          local_48.first = (int *)local_48.size;
          if ((pointer)local_48.size != (pointer)0x0) {
            local_48.first = (this->lits_).ebo_.buf;
          }
        }
        uVar5 = addRule(this,head,&local_48);
      }
      return uVar5;
    }
    iVar8 = pWVar2[uVar7].weight;
    if (this->bound_ < pWVar2[uVar7].weight) {
      iVar8 = this->bound_;
    }
    pWVar2[uVar7].weight = iVar8;
    lVar6 = lVar6 + iVar8;
    plVar3[uVar7] = lVar6;
  } while ((-1 < iVar8) && (lVar6 < 0x80000000));
  Potassco::fail(-2,
                 "uint32 Clasp::Asp::RuleTransform::Impl::transform(Atom_t, weight_t, const Potassco::WeightLitSpan &, Strategy)"
                 ,0xb7,"agg_[i].weight >= 0 && sum <= ( 2147483647)","invalid weight rule",0);
}

Assistant:

uint32 RuleTransform::Impl::transform(Atom_t head, weight_t bound, const Potassco::WeightLitSpan& wlits, Strategy s) {
	bound_ = bound;
	agg_.assign(begin(wlits), end(wlits));
	if (!isSorted(agg_.begin(), agg_.end(), CmpW())) {
		std::stable_sort(agg_.begin(), agg_.end(), CmpW());
	}
	wsum_t sum = 0;
	sumR_.resize(agg_.size());
	for (WLitVec::size_type i = agg_.size(); i--;) {
		agg_[i].weight = std::min(agg_[i].weight, bound_);
		sumR_[i] = (sum += agg_[i].weight);
		POTASSCO_REQUIRE(agg_[i].weight >= 0 && sum <= CLASP_WEIGHT_T_MAX, "invalid weight rule");
	}
	if      (bound_ > sum) { return 0; }
	else if (bound_ <= 0)  { return addRule(head, Potassco::toSpan<Potassco::Lit_t>()); }
	else if ((sum - agg_.back().weight) < bound_) { // normal rule
		lits_.clear();
		for (WLitVec::const_iterator it = agg_.begin(), end = agg_.end(); it != end; ++it) {
			lits_.push_back(lit(*it));
		}
		return addRule(head, Potassco::toSpan(lits_));
	}
	else {
		return ((s == strategy_no_aux || (sum < 6 && s == strategy_default))
			? transformSelect(head)
			: transformSplit(head));
	}
}